

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O2

void __thiscall gdsForge::gdsBegin(gdsForge *this)

{
  int *arrInt;
  allocator<char> local_35;
  int tempArr [1];
  string local_30;
  
  tempArr[0] = 600;
  GDSwriteInt(this,2,tempArr,1);
  arrInt = gsdTime();
  GDSwriteInt(this,0x102,arrInt,0xc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"ColdFlux.db",&local_35);
  GDSwriteStr(this,0x206,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  GDSwriteUnits(this);
  return;
}

Assistant:

void gdsForge::gdsBegin()
{
  int tempArr[1];

  tempArr[0] = 600;
  this->GDSwriteInt(GDS_HEADER, tempArr, 1);

  this->GDSwriteInt(GDS_BGNLIB, gsdTime(), 12);

  this->GDSwriteStr(GDS_LIBNAME, "ColdFlux.db");

  this->GDSwriteUnits();
  // Precision error, ultra fine...
  // double dArr[2] = {0.001, 1e-9};
  // GDSwriteRea(GDS_UNITS, dArr, 2);
}